

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O0

void __thiscall wasm::ShellExternalInterface::Memory::resize(Memory *this,size_t newSize)

{
  size_type sVar1;
  unsigned_long *puVar2;
  reference __s;
  size_t oldSize;
  size_t minSize;
  size_t newSize_local;
  Memory *this_local;
  
  oldSize = 0x1000;
  minSize = newSize;
  newSize_local = (size_t)this;
  sVar1 = std::vector<char,_std::allocator<char>_>::size(&this->memory);
  puVar2 = std::max<unsigned_long>(&oldSize,&minSize);
  std::vector<char,_std::allocator<char>_>::resize(&this->memory,*puVar2);
  if ((minSize < sVar1) && (minSize < 0x1000)) {
    __s = std::vector<char,_std::allocator<char>_>::operator[](&this->memory,minSize);
    memset(__s,0,0x1000 - minSize);
  }
  return;
}

Assistant:

void resize(size_t newSize) {
      // Ensure the smallest allocation is large enough that most allocators
      // will provide page-aligned storage. This hopefully allows the
      // interpreter's memory to be as aligned as the memory being simulated,
      // ensuring that the performance doesn't needlessly degrade.
      //
      // The code is optimistic this will work until WG21's p0035r0 happens.
      const size_t minSize = 1 << 12;
      size_t oldSize = memory.size();
      memory.resize(std::max(minSize, newSize));
      if (newSize < oldSize && newSize < minSize) {
        std::memset(&memory[newSize], 0, minSize - newSize);
      }
    }